

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_stl(DisasContext_conflict1 *s,arg_STL *a,MemOp mop)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 a32;
  TCGv_i32 val;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  TCGContext_conflict1 *tcg_ctx;
  MemOp mop_local;
  arg_STL *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,0x1b);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else if ((a->rn == 0xf) || (a->rt == 0xf)) {
    unallocated_encoding_aarch64(s);
    s_local._7_1_ = true;
  }
  else {
    a32 = load_reg(s,a->rn);
    val = load_reg(s,a->rt);
    tcg_gen_mb_aarch64(tcg_ctx_00,TCG_BAR_STRL|TCG_MO_ALL);
    iVar1 = get_mem_index(s);
    gen_aa32_st_i32(s,val,a32,iVar1,mop | s->be_data);
    disas_set_da_iss(s,mop,a->rt | (ISSIsWrite|ISSIsAcqRel));
    tcg_temp_free_i32(tcg_ctx_00,val);
    tcg_temp_free_i32(tcg_ctx_00,a32);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool op_stl(DisasContext *s, arg_STL *a, MemOp mop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr, tmp;

    if (!ENABLE_ARCH_8) {
        return false;
    }
    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rn == 15 || a->rt == 15) {
        unallocated_encoding(s);
        return true;
    }

    addr = load_reg(s, a->rn);
    tmp = load_reg(s, a->rt);
    tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_STRL);
    gen_aa32_st_i32(s, tmp, addr, get_mem_index(s), mop | s->be_data);
    disas_set_da_iss(s, mop, a->rt | ISSIsAcqRel | ISSIsWrite);

    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_temp_free_i32(tcg_ctx, addr);
    return true;
}